

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::markAsDisconnected(CoreBroker *this,GlobalBrokerId brkid)

{
  GlobalBrokerId brkid_00;
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  ulong uVar5;
  long lVar6;
  
  pBVar1 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar1) {
    lVar6 = 0x2c;
    uVar5 = 0;
    do {
      brkid_00.gid = *(BaseType *)((long)pBVar1 + lVar6 + -0xc);
      if ((brkid_00.gid == brkid.gid) &&
         (*(char *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar6) != '(')) {
        *(undefined1 *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar6) = 0x32;
      }
      if ((*(int *)((long)pBVar1 + lVar6 + -4) == brkid.gid) &&
         (*(char *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar6) != '(')) {
        *(undefined1 *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar6) = 0x32;
        markAsDisconnected(this,brkid_00);
        pBVar1 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar3 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x58;
    } while (uVar5 < (ulong)(((long)pBVar3 - (long)pBVar1 >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  pBVar2 = (this->mFederates).dataStorage.
           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar4 = (this->mFederates).dataStorage.
           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar4 != pBVar2) {
    lVar6 = 0x30;
    uVar5 = 0;
    do {
      if (((*(int *)((long)pBVar2 + lVar6 + -8) == brkid.gid) &&
          (*(char *)((long)pBVar2 + lVar6 + -4) != '(')) &&
         (*(undefined1 *)((long)pBVar2 + lVar6 + -4) = 0x32,
         *(char *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar6) == '\x01')) {
        HandleManager::removeFederateHandles
                  (&this->handles,(GlobalFederateId)*(BaseType *)((long)pBVar2 + lVar6 + -0x10));
        pBVar2 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pBVar4 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x38;
    } while (uVar5 < (ulong)(((long)pBVar4 - (long)pBVar2 >> 3) * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void CoreBroker::markAsDisconnected(GlobalBrokerId brkid)
{
    // using regular loop here since dual mapped vector shouldn't produce a modifiable lvalue
    for (size_t ii = 0; ii < mBrokers.size(); ++ii) {  // NOLINT
        auto& brk = mBrokers[ii];
        if (brk.global_id == brkid) {
            if (brk.state != ConnectionState::ERROR_STATE) {
                brk.state = ConnectionState::DISCONNECTED;
            }
        }
        if (brk.parent == brkid) {
            if (brk.state != ConnectionState::ERROR_STATE) {
                brk.state = ConnectionState::DISCONNECTED;
                markAsDisconnected(brk.global_id);
            }
        }
    }
    for (size_t ii = 0; ii < mFederates.size(); ++ii) {  // NOLINT
        auto& fed = mFederates[ii];

        if (fed.parent == brkid) {
            if (fed.state != ConnectionState::ERROR_STATE) {
                fed.state = ConnectionState::DISCONNECTED;
                if (fed.reentrant) {
                    handles.removeFederateHandles(fed.global_id);
                }
            }
        }
    }
}